

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageLoadStoreTests.cpp
# Opt level: O3

void __thiscall
vkt::image::anon_unknown_0::StoreTestInstance::StoreTestInstance
          (StoreTestInstance *this,Context *context,Texture *texture,VkFormat format,
          bool declareImageFormatInShader,bool singleLayerBind)

{
  MovePtr<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> *this_00;
  int iVar1;
  long lVar2;
  TextureFormat format_00;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  Buffer *this_01;
  UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_> local_78;
  VkBufferCreateInfo local_68;
  
  (this->super_BaseTestInstance).super_TestInstance.m_context = context;
  (this->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__TestInstance_00d33790;
  lVar2 = 4;
  do {
    (this->super_BaseTestInstance).m_texture.m_layerSize.m_data[lVar2 + -4] =
         (texture->m_layerSize).m_data[lVar2 + -4];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 7);
  (this->super_BaseTestInstance).m_texture.m_numSamples = texture->m_numSamples;
  iVar1 = texture->m_numLayers;
  (this->super_BaseTestInstance).m_texture.m_type = texture->m_type;
  (this->super_BaseTestInstance).m_texture.m_numLayers = iVar1;
  (this->super_BaseTestInstance).m_format = format;
  (this->super_BaseTestInstance).m_declareImageFormatInShader = declareImageFormatInShader;
  (this->super_BaseTestInstance).m_singleLayerBind = singleLayerBind;
  (this->super_BaseTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__StoreTestInstance_00d33730;
  this_00 = &this->m_imageBuffer;
  (this->m_imageBuffer).
  super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>.m_data.ptr =
       (Buffer *)0x0;
  Texture::size(texture);
  format_00 = ::vk::mapVkFormat(format);
  iVar1 = tcu::getPixelSize(format_00);
  this->m_imageSizeBytes =
       (long)(int)(iVar1 * local_68.sType * local_68._4_4_ * (int)local_68.pNext);
  vk = Context::getDeviceInterface((this->super_BaseTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_BaseTestInstance).super_TestInstance.m_context);
  allocator = Context::getDefaultAllocator
                        ((this->super_BaseTestInstance).super_TestInstance.m_context);
  this_01 = (Buffer *)operator_new(0x30);
  makeBufferCreateInfo(&local_68,this->m_imageSizeBytes,10);
  image::Buffer::Buffer(this_01,vk,device,allocator,&local_68,(MemoryRequirement)0x1);
  local_78.m_data.ptr = (Buffer *)0x0;
  if ((this_00->super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).
      m_data.ptr != this_01) {
    de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
              (&this_00->
                super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>);
    (this_00->super_UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>).m_data.
    ptr = this_01;
  }
  de::details::UniqueBase<vkt::image::Buffer,_de::DefaultDeleter<vkt::image::Buffer>_>::reset
            (&local_78);
  return;
}

Assistant:

StoreTestInstance::StoreTestInstance (Context& context, const Texture& texture, const VkFormat format, const bool declareImageFormatInShader, const bool singleLayerBind)
	: BaseTestInstance		(context, texture, format, declareImageFormatInShader, singleLayerBind)
	, m_imageSizeBytes		(getImageSizeBytes(texture.size(), format))
{
	const DeviceInterface&	vk			= m_context.getDeviceInterface();
	const VkDevice			device		= m_context.getDevice();
	Allocator&				allocator	= m_context.getDefaultAllocator();

	// A helper buffer with enough space to hold the whole image. Usage flags accommodate all derived test instances.

	m_imageBuffer = de::MovePtr<Buffer>(new Buffer(
		vk, device, allocator,
		makeBufferCreateInfo(m_imageSizeBytes, VK_BUFFER_USAGE_STORAGE_TEXEL_BUFFER_BIT | VK_BUFFER_USAGE_TRANSFER_DST_BIT),
		MemoryRequirement::HostVisible));
}